

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int test_signed<signed_char>(char *Name)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  char local_1c;
  undefined1 local_1b;
  uint8_t local_1a [2];
  char tmp2;
  uint8_t tmp [1];
  uint8_t cst_minus10_be [1];
  char *pcStack_18;
  uint8_t cst_minus10_le [1];
  char *Name_local;
  
  pcStack_18 = Name;
  memset(local_1a + 1,0xff,1);
  memset(local_1a,0xff,1);
  local_1a[1] = 0xf6;
  local_1a[0] = 0xf6;
  cVar1 = intmem::loadu_le<signed_char>(local_1a + 1);
  if (cVar1 == -10) {
    cVar1 = intmem::loadu_be<signed_char>(local_1a);
    if (cVar1 == -10) {
      cVar1 = intmem::load_le<signed_char>((char *)(local_1a + 1));
      if (cVar1 == -10) {
        cVar1 = intmem::load_be<signed_char>((char *)local_1a);
        if (cVar1 == -10) {
          intmem::storeu_le<signed_char>(&local_1b,-10);
          iVar2 = memcmp(&local_1b,local_1a + 1,1);
          if (iVar2 == 0) {
            intmem::storeu_be<signed_char>(&local_1b,-10);
            iVar2 = memcmp(&local_1b,local_1a,1);
            if (iVar2 == 0) {
              intmem::store_le<signed_char>(&local_1c,-10);
              iVar2 = memcmp(&local_1c,local_1a + 1,1);
              if (iVar2 == 0) {
                intmem::storeu_be<signed_char>(&local_1c,-10);
                iVar2 = memcmp(&local_1c,local_1a,1);
                if (iVar2 == 0) {
                  Name_local._4_4_ = 0;
                }
                else {
                  poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
                  poVar3 = std::operator<<(poVar3,": error storing BE integer!");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  Name_local._4_4_ = 1;
                }
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
                poVar3 = std::operator<<(poVar3,": error storing LE integer!");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                Name_local._4_4_ = 1;
              }
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
              poVar3 = std::operator<<(poVar3,": error storing BE integer!");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              Name_local._4_4_ = 1;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
            poVar3 = std::operator<<(poVar3,": error storing LE integer!");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            Name_local._4_4_ = 1;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
          poVar3 = std::operator<<(poVar3,": error loading BE signed integer!");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          Name_local._4_4_ = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
        poVar3 = std::operator<<(poVar3,": error loading LE signed integer!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        Name_local._4_4_ = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
      poVar3 = std::operator<<(poVar3,": error loading BE signed integer!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Name_local._4_4_ = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,pcStack_18);
    poVar3 = std::operator<<(poVar3,": error loading LE signed integer!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Name_local._4_4_ = 1;
  }
  return Name_local._4_4_;
}

Assistant:

int test_signed(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_minus10_le[sizeof(T)];
  ALIGN(alignof(T)) uint8_t cst_minus10_be[sizeof(T)];
  memset(&cst_minus10_le[0], 0xFF, sizeof(T));
  memset(&cst_minus10_be[0], 0xFF, sizeof(T));
  cst_minus10_le[0] = 0xF6;
  cst_minus10_be[sizeof(T)-1] = 0xF6;
  if (loadu_le<T>(cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }

  uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, -10);
  if (memcmp(tmp, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>((T*) tmp, -10);
  if (memcmp(tmp, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}